

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O3

void __thiscall StringTest::StringTest(StringTest *this,int number)

{
  char *pcVar1;
  char name [32];
  char acStack_48 [31];
  undefined1 local_29;
  
  TestCase::TestCase(&this->super_TestCase,"StringTest");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR__TestCase_00109ce8;
  this->mTestNum = number;
  snprintf(acStack_48,0x20,"StringTest%d",(ulong)(number + 1));
  local_29 = 0;
  pcVar1 = (char *)(this->super_TestCase).mTestName._M_string_length;
  strlen(acStack_48);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_TestCase).mTestName,0,pcVar1,(ulong)acStack_48);
  return;
}

Assistant:

StringTest( int number ) : 
		TestCase( "StringTest" ), mTestNum( number ) 
	{
		char name[ 32 ];
		snprintf( name, 32, "StringTest%d", number + 1 );
		name[ 31 ] = '\0';
		SetTestName( name );	
	}